

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::iterate(UBOBindingRenderCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  TestType TVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar9;
  bool imageTestPassed;
  ulong uVar10;
  int drawCycle;
  long lVar11;
  ulong uVar12;
  bool local_1fd;
  GLint val;
  int local_1f8;
  int local_1f4;
  uint local_1f0;
  GLenum prop;
  string *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  string name;
  MessageBuilder local_1b0;
  long lVar8;
  
  iVar5 = (*((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  uVar1 = (this->super_LayoutBindingRenderCase).m_numBindings;
  prop = 0x9302;
  TVar2 = (this->super_LayoutBindingRenderCase).m_testType;
  LayoutBindingRenderCase::initRenderState(&this->super_LayoutBindingRenderCase);
  local_1f0 = TVar2 - TESTTYPE_BINDING_ARRAY;
  local_1e8 = &(this->super_LayoutBindingRenderCase).m_uniformName;
  uVar10 = 0;
  local_1e0 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    local_1e0 = uVar10;
  }
  imageTestPassed = true;
  local_1f8 = 0;
  local_1fd = true;
  uVar12 = 0;
  while (uVar12 != local_1e0) {
    if (local_1f0 < 2) {
      getUniformName(&name,local_1e8,0,(int)uVar12);
    }
    else {
      getUniformName(&name,local_1e8,(int)uVar12);
    }
    local_1f4 = (this->super_LayoutBindingRenderCase).m_bindings.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar12];
    val = -1;
    pcVar3 = *(code **)(lVar8 + 0x9c8);
    dVar7 = (((this->super_LayoutBindingRenderCase).m_program)->m_program).m_program;
    local_1d8 = uVar12;
    uVar6 = (**(code **)(lVar8 + 0x9a8))(dVar7,0x92e2,name._M_dataplus._M_p);
    (*pcVar3)(dVar7,0x92e2,uVar6,1,&prop,1,0,&val);
    local_1b0.m_log =
         ((this->super_LayoutBindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Querying binding point for ");
    std::operator<<((ostream *)this_00,(string *)&name);
    std::operator<<((ostream *)this_00,": ");
    std::ostream::operator<<(this_00,val);
    std::operator<<((ostream *)this_00," == ");
    std::ostream::operator<<(this_00,local_1f4);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"Binding point query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                    ,0x6d0);
    lVar9 = (long)local_1f8 << 4;
    local_1fd = (bool)(local_1fd & val == local_1f4);
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      (**(code **)(lVar8 + 0x14f0))
                ((this->super_LayoutBindingRenderCase).m_shaderProgramArrayNdxLoc,
                 (int)lVar11 + (int)uVar10);
      bVar4 = LayoutBindingRenderCase::drawAndVerifyResult
                        (&this->super_LayoutBindingRenderCase,
                         (Vec4 *)((long)((this->m_expectedColors).
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9)
                        );
      imageTestPassed = (bool)(imageTestPassed & bVar4);
      lVar9 = lVar9 + 0x10;
    }
    std::__cxx11::string::~string((string *)&name);
    local_1f8 = local_1f8 + 2;
    uVar10 = uVar10 + 2;
    uVar12 = local_1d8 + 1;
  }
  LayoutBindingRenderCase::setTestResult
            (&this->super_LayoutBindingRenderCase,local_1fd,imageTestPassed);
  return STOP;
}

Assistant:

TestCase::IterateResult UBOBindingRenderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const int				iterations		= m_numBindings;
	const glw::GLenum		prop			= GL_BUFFER_BINDING;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	bool					queryTestPassed	= true;
	bool					imageTestPassed = true;

	// Set the viewport and enable the shader program
	initRenderState();

	for (int iterNdx = 0; iterNdx < iterations; ++iterNdx)
	{
		// Query binding point
		const std::string	name	= (arrayInstance ? getUniformName(m_uniformName, 0, iterNdx) : getUniformName(m_uniformName, iterNdx));
		const glw::GLint	binding = m_bindings[iterNdx];
		glw::GLint			val		= -1;

		gl.getProgramResourceiv(m_program->getProgram(), GL_UNIFORM_BLOCK, gl.getProgramResourceIndex(m_program->getProgram(), GL_UNIFORM_BLOCK, name.c_str() ), 1, &prop, 1, DE_NULL, &val);
		m_testCtx.getLog() << tcu::TestLog::Message << "Querying binding point for " << name << ": " << val << " == " << binding << tcu::TestLog::EndMessage;
		GLU_EXPECT_NO_ERROR(gl.getError(), "Binding point query failed");

		if (val != binding)
			queryTestPassed = false;

		// Draw twice to render both colors within the UBO
		for (int drawCycle = 0; drawCycle < 2; ++drawCycle)
		{
			// Set the uniform indicating the array index to be used and set the expected color
			const int arrayNdx = iterNdx*2 + drawCycle;
			gl.uniform1i(m_shaderProgramArrayNdxLoc, arrayNdx);

			if (!drawAndVerifyResult(m_expectedColors[arrayNdx]))
				imageTestPassed = false;
		}
	}

	setTestResult(queryTestPassed, imageTestPassed);
	return STOP;
}